

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void put4bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                  int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t **ppuVar1;
  uint32_t *puVar2;
  byte *pbVar3;
  uint32_t *puVar4;
  uint32_t _x;
  uint32_t uVar5;
  long lVar6;
  bool bVar7;
  
  ppuVar1 = img->BWmap;
  while (bVar7 = h != 0, h = h - 1, bVar7) {
    lVar6 = 0;
    puVar4 = cp;
    for (uVar5 = w; 1 < uVar5; uVar5 = uVar5 - 2) {
      puVar2 = ppuVar1[pp[lVar6]];
      cp[lVar6 * 2] = *puVar2;
      puVar4 = puVar4 + 2;
      cp[lVar6 * 2 + 1] = puVar2[1];
      lVar6 = lVar6 + 1;
    }
    if (uVar5 == 0) {
      pbVar3 = pp + lVar6;
    }
    else {
      pbVar3 = pp + lVar6 + 1;
      *puVar4 = *ppuVar1[pp[lVar6]];
      puVar4 = puVar4 + 1;
    }
    pp = pbVar3 + fromskew / 2;
    cp = puVar4 + toskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put4bitbwtile)
{
    uint32_t **BWmap = img->BWmap;

    (void)x;
    (void)y;
    fromskew /= 2;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL2(w, bw = BWmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}